

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

bsc_step_t
bsc_exec_reduce(bsc_step_t depends,bsc_reduce_t reducer,void *a,void *a0,void *xs,bsc_size_t size)

{
  request_t *prVar1;
  
  prVar1 = new_request(depends);
  prVar1->kind = EXEC;
  (prVar1->payload).exec.func = reducer;
  (prVar1->payload).put.dst_addr = a;
  (prVar1->payload).exec.a0 = a0;
  (prVar1->payload).exec.xs = xs;
  (prVar1->payload).exec.size = size;
  return depends + 1;
}

Assistant:

bsc_step_t bsc_exec_reduce( bsc_step_t depends, 
        bsc_reduce_t reducer, void * a, const void * a0,
        const void * xs, bsc_size_t size  )
{
    request_t * req;
    exec_request_t r;
    r.func = reducer;
    r.a= a;
    r.a0 = a0;
    r.xs = xs;
    r.size = size;
    
    req = new_request( depends );
    req->kind = EXEC;
    req->payload.exec = r;
    return depends + 1;
}